

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_NUM_TYPE JlIsObjectNumberHex(JlDataObject *NumberObject)

{
  byte local_11;
  _Bool isHex;
  JlDataObject *NumberObject_local;
  
  local_11 = 0;
  if (((NumberObject != (JlDataObject *)0x0) && (NumberObject->Type == JL_DATA_TYPE_NUMBER)) &&
     ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_UNSIGNED)) {
    local_11 = (NumberObject->field_2).Number.IsHex & 1;
  }
  return (JL_NUM_TYPE)local_11;
}

Assistant:

JL_NUM_TYPE
    JlIsObjectNumberHex
    (
        JlDataObject const*     NumberObject
    )
{
    bool isHex = false;

    if(     NULL != NumberObject
        &&  JL_DATA_TYPE_NUMBER == NumberObject->Type
        &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type )
    {
        isHex = NumberObject->Number.IsHex;
    }

    return isHex;
}